

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_interface.h
# Opt level: O0

ReturnType_conflict
ezy::features::result_interface<ezy::features::result_adapter>::
impl<ezy::strong_type<std::variant<move_only,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
::_impl::
success_or<ezy::strong_type<std::variant<move_only,std::__cxx11::string>,void,ezy::features::result_like_continuation>,move_only>
          (strong_type<std::variant<move_only,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
           *t,move_only *alternative)

{
  bool bVar1;
  type *ptVar2;
  variant_alternative_t<0UL,_variant<move_only,_basic_string<char>_>_> *pvVar3;
  move_only *alternative_local;
  strong_type<std::variant<move_only,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
  *t_local;
  
  ptVar2 = ezy::detail::
           strong_type_base<std::variant<move_only,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
           ::get(&t->
                  super_strong_type_base<std::variant<move_only,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                );
  bVar1 = result_adapter<std::variant<move_only,std::__cxx11::string>>::
          is_success<std::variant<move_only,std::__cxx11::string>>(ptVar2);
  if (bVar1) {
    ptVar2 = ezy::detail::
             strong_type_base<std::variant<move_only,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             ::get(&t->
                    super_strong_type_base<std::variant<move_only,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                  );
    pvVar3 = result_adapter<std::variant<move_only,std::__cxx11::string>>::
             get_success<std::variant<move_only,std::__cxx11::string>>(ptVar2);
    t_local._4_4_ = pvVar3->i;
  }
  else {
    t_local._4_4_ = alternative->i;
  }
  return (ReturnType_conflict)t_local._4_4_;
}

Assistant:

static constexpr decltype(auto) success_or(ST&& t, Alternative&& alternative)
        {
          using dST = ezy::remove_cvref_t<ST>;
          using trait = Adapter<typename dST::type>;

          using ReturnType = typename trait::success_type;
          if (trait::is_success(std::forward<ST>(t).get()))
            return ReturnType{trait::get_success(std::forward<ST>(t).get())};
          else
            return ReturnType{std::forward<Alternative>(alternative)};
        }